

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_PrintBold
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  undefined8 *puVar2;
  UCVarValue value;
  UCVarValue value_00;
  PClass *pPVar3;
  undefined8 uVar4;
  PClass *pPVar5;
  VMValue *pVVar6;
  FFont *font;
  char *pcVar7;
  bool bVar8;
  FString text;
  FString formatted;
  FString local_50;
  FString local_48;
  float local_40;
  undefined4 uStack_3c;
  float local_34;
  double local_30;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar2 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar4 = (**(code **)*puVar2)(puVar2);
          puVar2[1] = uVar4;
        }
        pPVar5 = (PClass *)puVar2[1];
        bVar8 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar8) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar8 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar8) {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d283b;
        }
      }
      if (numparam == 1) {
        pcVar7 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x02') {
          FString::AttachToOther(&local_50,(FString *)(param + 1));
          if (numparam < 3) {
            pVVar6 = defaultparam->Array;
            if (pVVar6[2].field_0.field_3.Type != '\x01') {
              pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003d285a;
            }
          }
          else {
            pVVar6 = param;
            if (param[2].field_0.field_3.Type != '\x01') {
              pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d285a:
              __assert_fail(pcVar7,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0xc66,
                            "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          local_30 = pVVar6[2].field_0.f;
          if (numparam < 4) {
            param = defaultparam->Array;
            if (param[3].field_0.field_3.Type == '\0') goto LAB_003d26f8;
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
LAB_003d26f8:
              iVar1 = param[3].field_0.i;
              local_34 = con_midtime.Value;
              if (*local_50.Chars == '$') {
                pcVar7 = FStringTable::operator()(&GStrings,local_50.Chars + 1);
                FString::operator=(&local_50,pcVar7);
              }
              if (iVar1 == 0) {
                font = (FFont *)0x0;
              }
              else {
                font = V_GetFont(FName::NameData.NameArray[iVar1].Text);
              }
              if (0.0 < local_30) {
                local_40 = (float)local_30;
                value._4_4_ = uStack_3c;
                value.Float = local_40;
                FBaseCVar::SetGenericRep(&con_midtime.super_FBaseCVar,value,CVAR_Float);
              }
              strbin1((char *)&local_48);
              if (font == (FFont *)0x0) {
                font = SmallFont;
              }
              C_MidPrintBold(font,local_48.Chars);
              local_40 = local_34;
              value_00._4_4_ = uStack_3c;
              value_00.Float = local_34;
              FBaseCVar::SetGenericRep(&con_midtime.super_FBaseCVar,value_00,CVAR_Float);
              FString::~FString(&local_48);
              FString::~FString(&local_50);
              return 0;
            }
            pcVar7 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xc67,
                        "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar7 = "param[paramnum].Type == REGT_STRING";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xc65,
                    "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d283b:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xc64,
                "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PrintBold)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STRING	(text);
	PARAM_FLOAT_DEF	(time);
	PARAM_NAME_DEF	(fontname);

	float saved = con_midtime;
	FFont *font = NULL;
	
	if (text[0] == '$') text = GStrings(&text[1]);
	if (fontname != NAME_None)
	{
		font = V_GetFont(fontname);
	}
	if (time > 0)
	{
		con_midtime = float(time);
	}
	FString formatted = strbin1(text);
	C_MidPrintBold(font != NULL ? font : SmallFont, formatted.GetChars());
	con_midtime = saved;
	return 0;
}